

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall
amrex::ParmParse::addarr(ParmParse *this,char *name,vector<int,_std::allocator<int>_> *ptr)

{
  char *in_RSI;
  vector<int,_std::allocator<int>_> *in_stack_000001b8;
  string *in_stack_000001c0;
  allocator local_59;
  string local_58 [32];
  string *in_stack_ffffffffffffffc8;
  ParmParse *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,in_RSI,&local_59);
  prefixedName(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  anon_unknown_12::anon_unknown_0::saddarr<int>(in_stack_000001c0,in_stack_000001b8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void
ParmParse::addarr (const char* name,
                const std::vector<int>&  ptr)
{
    saddarr(prefixedName(name),ptr);
}